

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdnsBlock::parse_map_item(cdnsBlock *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  char *local_88;
  int nb_e;
  char *e [5];
  int *err_local;
  int64_t val_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdnsBlock *this_local;
  
  e[4] = (char *)err;
  switch(val) {
  case 0:
    in_max_local = cdns_block_preamble::parse(&this->preamble,in,in_max,err,this);
    break;
  case 1:
    in_max_local = cdns_block_statistics::parse(&this->statistics,in,in_max,err,this);
    break;
  case 2:
    in_max_local = cdnsBlockTables::parse(&this->tables,in,in_max,err,this);
    break;
  case 3:
    in_max_local = cbor_ctx_array_parse<cdns_query,cdnsBlock>(in,in_max,&this->queries,err,this);
    break;
  case 4:
    in_max_local = cbor_ctx_array_parse<cdns_address_event_count,cdnsBlock>
                             (in,in_max,&this->address_events,err,this);
    break;
  default:
    in_max_local = cbor_skip(in,in_max,err);
  }
  if (in_max_local == (uint8_t *)0x0) {
    memcpy(&stack0xffffffffffffffa8,&PTR_anon_var_dwarf_20b1f_0025a390,0x28);
    if ((val < 0) || (4 < val)) {
      local_88 = "unknown";
    }
    else {
      local_88 = *(char **)(&stack0xffffffffffffffa8 + val * 8);
    }
    fprintf(_stderr,"Cannot parse block element %d (%s), err=%d\n",val & 0xffffffff,local_88,
            (ulong)*(uint *)e[4]);
  }
  return in_max_local;
}

Assistant:

uint8_t* cdnsBlock::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    switch (val) {
    case 0: /* Block preamble */
        in = preamble.parse(in, in_max, err, this);
        break;
    case 1: /* Block statistics */
        in = statistics.parse(in, in_max, err, this);
        break;
    case 2: /* Block Tables */
        in = tables.parse(in, in_max, err, this);
        break;
    case 3: /* Block Queries */
        in = cbor_ctx_array_parse(in, in_max, &queries, err, this);
        break;
    case 4: /* Address event counts */
        in = cbor_ctx_array_parse(in, in_max, &address_events, err, this);
        break;
    default:
         in = cbor_skip(in, in_max, err);
        break;
    }

    if (in == NULL) {
        char const* e[] = { "preamble", "statistics", "tables", "queries", "address_events" };
        int nb_e = (int)sizeof(e) / sizeof(char const*);

        fprintf(stderr, "Cannot parse block element %d (%s), err=%d\n", (int)val, (val >= 0 && val < nb_e) ? e[val] : "unknown", *err);
    }
    return in;
}